

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O1

void ShiftBytes(VP8LBitReader *br)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  bVar2 = true;
  if (7 < br->bit_pos) {
    uVar4 = br->pos;
    iVar3 = br->bit_pos;
    do {
      iVar5 = iVar3;
      if (br->len <= uVar4) break;
      uVar1 = br->val;
      br->val = uVar1 >> 8;
      br->val = (ulong)br->buf[uVar4] << 0x38 | uVar1 >> 8;
      uVar4 = uVar4 + 1;
      br->pos = uVar4;
      iVar5 = iVar3 + -8;
      br->bit_pos = iVar5;
      bVar2 = 0xf < iVar3;
      iVar3 = iVar5;
    } while (bVar2);
    bVar2 = iVar5 < 0x41;
  }
  if ((br->eos != 0) || (!(bool)(br->pos != br->len | bVar2))) {
    br->bit_pos = 0;
    br->eos = 1;
  }
  return;
}

Assistant:

static void ShiftBytes(VP8LBitReader* const br) {
  while (br->bit_pos >= 8 && br->pos < br->len) {
    br->val >>= 8;
    br->val |= ((vp8l_val_t)br->buf[br->pos]) << (VP8L_LBITS - 8);
    ++br->pos;
    br->bit_pos -= 8;
  }
  if (VP8LIsEndOfStream(br)) {
    VP8LSetEndOfStream(br);
  }
}